

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_Apu.cpp
# Opt level: O2

void __thiscall Simple_Apu::Simple_Apu(Simple_Apu *this)

{
  Blip_Buffer *this_00;
  
  Nes_Apu::Nes_Apu(&this->apu);
  this_00 = &this->buf;
  Blip_Buffer::Blip_Buffer(this_00);
  this->time = 0;
  this->frame_length = 0x7454;
  (this->apu).dmc.rom_reader_data = (void *)0x0;
  (this->apu).dmc.rom_reader = null_dmc_reader;
  Nes_Apu::output(&this->apu,this_00);
  Blip_Buffer::clock_rate(this_00,0x1b4f4d);
  Blip_Buffer::sample_rate(this_00,0xac44,1000);
  Nes_Apu::reset(&this->apu,false,0);
  Blip_Buffer::clear(this_00,true);
  return;
}

Assistant:

Simple_Apu::Simple_Apu()
{
	time = 0;
	frame_length = 29780;
	apu.dmc_reader( null_dmc_reader, NULL );

	apu.output( &buf );
	buf.clock_rate( 1789773 );
	buf.sample_rate( 44100, 1000 );

	apu.reset(false, 0);
	buf.clear();
}